

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputFile.cpp
# Opt level: O0

void __thiscall OutputFile::~OutputFile(OutputFile *this)

{
  OutputFile *this_00;
  bool bVar1;
  reference ppOVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  OutputFile *this_local;
  
  it._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::begin(&this->descendants);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::end(&this->descendants);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppOVar2 = std::_List_iterator<OutputFile_*>::operator*(&local_18);
    this_00 = *ppOVar2;
    if (this_00 != (OutputFile *)0x0) {
      ~OutputFile(this_00);
      operator_delete(this_00,0xd8);
    }
    std::_List_iterator<OutputFile_*>::operator++(&local_18);
  }
  std::__cxx11::string::~string((string *)&this->keySeparator);
  std::__cxx11::string::~string((string *)&this->eol);
  std::__cxx11::string::~string((string *)&this->value);
  std::__cxx11::string::~string((string *)&this->key);
  std::__cxx11::string::~string((string *)&this->version);
  std::__cxx11::string::~string((string *)&this->name);
  std::__cxx11::list<OutputFile_*,_std::allocator<OutputFile_*>_>::~list(&this->descendants);
  return;
}

Assistant:

OutputFile::~OutputFile() {
  for (list<OutputFile*>::iterator it = descendants.begin(); it != descendants.end(); ++it) {
    delete *it;
  }
}